

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionStats::~SectionStats(SectionStats *this)

{
  SectionStats *this_local;
  
  ~SectionStats(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

SectionStats::~SectionStats() = default;